

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O0

void __thiscall CVmMetaTable::clear(CVmMetaTable *this)

{
  long in_RDI;
  size_t i;
  vm_meta_entry_t *this_00;
  
  for (this_00 = (vm_meta_entry_t *)0x0; this_00 < *(vm_meta_entry_t **)(in_RDI + 0x10);
      this_00 = (vm_meta_entry_t *)((long)&this_00->meta_ + 1)) {
    vm_meta_entry_t::release_mem(this_00);
  }
  *(undefined8 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

void CVmMetaTable::clear()
{
    size_t i;
    
    /* delete all of the property tables in the entries */
    for (i = 0 ; i < count_ ; ++i)
        table_[i].release_mem();
    
    /* 
     *   Reset the entry counter.  Note that this doesn't affect any
     *   allocation; we keep a separate count of the number of table slots
     *   we have allocated.  Table slots don't have any additional
     *   associated memory, so we don't need to worry about cleaning
     *   anything up at this point. 
     */
    count_ = 0;
}